

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

int png_image_write_main(png_voidp argument)

{
  uint uVar1;
  png_imagep image_in;
  png_structrp png_ptr_00;
  png_inforp info_ptr_00;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  png_size_t size;
  png_voidp ptr;
  int bit_depth;
  bool bVar6;
  int local_c8;
  int local_c4;
  uint local_9c;
  bool local_96;
  bool local_95;
  png_uint_32 local_94;
  png_uint_32 y;
  ptrdiff_t row_bytes_1;
  png_const_bytep row_2;
  int result;
  png_bytep row_1;
  ptrdiff_t row_bytes;
  png_const_bytep row;
  png_uint_16 le;
  png_uint_32 entries;
  png_uint_32 png_row_stride;
  png_uint_32 check;
  uint channels;
  int write_16bit;
  int alpha;
  int linear;
  int colormap;
  png_uint_32 format;
  png_inforp info_ptr;
  png_structrp png_ptr;
  png_imagep image;
  png_image_write_control *display;
  png_voidp argument_local;
  
  image_in = *argument;
  png_ptr_00 = image_in->opaque->png_ptr;
  info_ptr_00 = image_in->opaque->info_ptr;
  linear = image_in->format;
  uVar4 = linear & 8;
  local_95 = uVar4 == 0 && (linear & 4U) != 0;
  local_96 = uVar4 == 0 && (linear & 1U) != 0;
  bVar6 = false;
  if ((local_95) && (bVar6 = false, uVar4 == 0)) {
    bVar6 = *(int *)((long)argument + 0x20) == 0;
  }
  png_set_benign_errors(png_ptr_00,0);
  if ((image_in->format & 8) == 0) {
    local_9c = (image_in->format & 3) + 1;
  }
  else {
    local_9c = 1;
  }
  if ((uint)(0x7fffffff / (ulong)local_9c) < image_in->width) {
    png_error(image_in->opaque->png_ptr,"image row stride too large");
  }
  local_9c = image_in->width * local_9c;
  if (*(int *)((long)argument + 0x10) == 0) {
    *(uint *)((long)argument + 0x10) = local_9c;
  }
  if (*(int *)((long)argument + 0x10) < 0) {
    entries = -*(int *)((long)argument + 0x10);
  }
  else {
    entries = *(png_uint_32 *)((long)argument + 0x10);
  }
  if (local_9c <= entries) {
    if ((uint)(0xffffffff / (ulong)local_9c) < image_in->height) {
      png_error(image_in->opaque->png_ptr,"memory image too large");
    }
    if ((linear & 8U) == 0) {
      bit_depth = 8;
      if (bVar6) {
        bit_depth = 0x10;
      }
      iVar3 = 0;
      if ((linear & 2U) != 0) {
        iVar3 = 2;
      }
      iVar5 = 0;
      if ((linear & 1U) != 0) {
        iVar5 = 4;
      }
      png_set_IHDR(png_ptr_00,info_ptr_00,image_in->width,image_in->height,bit_depth,iVar3 + iVar5,0
                   ,0,0);
    }
    else {
      if ((*(long *)((long)argument + 0x18) == 0) || (image_in->colormap_entries == 0)) {
        png_error(image_in->opaque->png_ptr,"no color-map for color-mapped image");
      }
      uVar1 = image_in->colormap_entries;
      if (uVar1 < 0x11) {
        if (uVar1 < 5) {
          local_c8 = 1;
          if (2 < uVar1) {
            local_c8 = 2;
          }
        }
        else {
          local_c8 = 4;
        }
        local_c4 = local_c8;
      }
      else {
        local_c4 = 8;
      }
      png_set_IHDR(png_ptr_00,info_ptr_00,image_in->width,image_in->height,local_c4,3,0,0,0);
      png_image_set_PLTE((png_image_write_control *)argument);
    }
    if (bVar6) {
      png_set_gAMA_fixed(png_ptr_00,info_ptr_00,100000);
      if ((image_in->flags & 1) == 0) {
        png_set_cHRM_fixed(png_ptr_00,info_ptr_00,0x7a26,0x8084,64000,33000,30000,60000,15000,6000);
      }
    }
    else if ((image_in->flags & 1) == 0) {
      png_set_sRGB(png_ptr_00,info_ptr_00,0);
    }
    else {
      png_set_gAMA_fixed(png_ptr_00,info_ptr_00,0xb18f);
    }
    png_write_info(png_ptr_00,info_ptr_00);
    if (bVar6) {
      png_set_swap(png_ptr_00);
    }
    if ((linear & 0x10U) != 0) {
      if ((uVar4 == 0) && ((linear & 2U) != 0)) {
        png_set_bgr(png_ptr_00);
      }
      linear = linear & 0xffffffef;
    }
    if ((linear & 0x20U) != 0) {
      if ((uVar4 == 0) && ((linear & 1U) != 0)) {
        png_set_swap_alpha(png_ptr_00);
      }
      linear = linear & 0xffffffdf;
    }
    if ((uVar4 != 0) && (image_in->colormap_entries < 0x11)) {
      png_set_packing(png_ptr_00);
    }
    if ((linear & 0xfffffff0U) == 0) {
      row_bytes = *(long *)((long)argument + 8);
      row_1 = (png_bytep)(long)*(int *)((long)argument + 0x10);
      if (local_95) {
        row_1 = (png_bytep)((long)row_1 << 1);
      }
      if ((long)row_1 < 0) {
        row_bytes = (ulong)(image_in->height - 1) * -(long)row_1 + row_bytes;
      }
      *(ptrdiff_t *)((long)argument + 0x28) = row_bytes;
      *(png_bytep *)((long)argument + 0x30) = row_1;
      if ((image_in->flags & 2) != 0) {
        png_set_filter(png_ptr_00,0,0);
        png_set_compression_level(png_ptr_00,3);
      }
      if (((local_95) && (local_96)) || ((uVar4 == 0 && (*(int *)((long)argument + 0x20) != 0)))) {
        size = png_get_rowbytes(png_ptr_00,info_ptr_00);
        ptr = png_malloc(png_ptr_00,size);
        *(png_voidp *)((long)argument + 0x38) = ptr;
        if (bVar6) {
          row_2._4_4_ = png_safe_execute(image_in,png_write_image_16bit,argument);
        }
        else {
          row_2._4_4_ = png_safe_execute(image_in,png_write_image_8bit,argument);
        }
        *(undefined8 *)((long)argument + 0x38) = 0;
        png_free(png_ptr_00,ptr);
        if (row_2._4_4_ == 0) {
          return 0;
        }
      }
      else {
        row_bytes_1 = *(ptrdiff_t *)((long)argument + 0x28);
        lVar2 = *(long *)((long)argument + 0x30);
        for (local_94 = image_in->height; local_94 != 0; local_94 = local_94 - 1) {
          png_write_row(png_ptr_00,(png_const_bytep)row_bytes_1);
          row_bytes_1 = lVar2 + row_bytes_1;
        }
      }
      png_write_end(png_ptr_00,info_ptr_00);
      return 1;
    }
    png_error(png_ptr_00,"png_write_image: unsupported transformation");
  }
  png_error(image_in->opaque->png_ptr,"supplied row stride too small");
}

Assistant:

static int
png_image_write_main(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   png_inforp info_ptr = image->opaque->info_ptr;
   png_uint_32 format = image->format;

   /* The following four ints are actually booleans */
   int colormap = (format & PNG_FORMAT_FLAG_COLORMAP);
   int linear = !colormap && (format & PNG_FORMAT_FLAG_LINEAR); /* input */
   int alpha = !colormap && (format & PNG_FORMAT_FLAG_ALPHA);
   int write_16bit = linear && !colormap && (display->convert_to_8bit == 0);

#   ifdef PNG_BENIGN_ERRORS_SUPPORTED
      /* Make sure we error out on any bad situation */
      png_set_benign_errors(png_ptr, 0/*error*/);
#   endif

   /* Default the 'row_stride' parameter if required, also check the row stride
    * and total image size to ensure that they are within the system limits.
    */
   {
      const unsigned int channels = PNG_IMAGE_PIXEL_CHANNELS(image->format);

      if (image->width <= 0x7fffffffU/channels) /* no overflow */
      {
         png_uint_32 check;
         const png_uint_32 png_row_stride = image->width * channels;

         if (display->row_stride == 0)
            display->row_stride = (png_int_32)/*SAFE*/png_row_stride;

         if (display->row_stride < 0)
            check = (png_uint_32)(-display->row_stride);

         else
            check = (png_uint_32)display->row_stride;

         if (check >= png_row_stride)
         {
            /* Now check for overflow of the image buffer calculation; this
             * limits the whole image size to 32 bits for API compatibility with
             * the current, 32-bit, PNG_IMAGE_BUFFER_SIZE macro.
             */
            if (image->height > 0xffffffffU/png_row_stride)
               png_error(image->opaque->png_ptr, "memory image too large");
         }

         else
            png_error(image->opaque->png_ptr, "supplied row stride too small");
      }

      else
         png_error(image->opaque->png_ptr, "image row stride too large");
   }

   /* Set the required transforms then write the rows in the correct order. */
   if ((format & PNG_FORMAT_FLAG_COLORMAP) != 0)
   {
      if (display->colormap != NULL && image->colormap_entries > 0)
      {
         png_uint_32 entries = image->colormap_entries;

         png_set_IHDR(png_ptr, info_ptr, image->width, image->height,
             entries > 16 ? 8 : (entries > 4 ? 4 : (entries > 2 ? 2 : 1)),
             PNG_COLOR_TYPE_PALETTE, PNG_INTERLACE_NONE,
             PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

         png_image_set_PLTE(display);
      }

      else
         png_error(image->opaque->png_ptr,
             "no color-map for color-mapped image");
   }

   else
      png_set_IHDR(png_ptr, info_ptr, image->width, image->height,
          write_16bit ? 16 : 8,
          ((format & PNG_FORMAT_FLAG_COLOR) ? PNG_COLOR_MASK_COLOR : 0) +
          ((format & PNG_FORMAT_FLAG_ALPHA) ? PNG_COLOR_MASK_ALPHA : 0),
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

   /* Counter-intuitively the data transformations must be called *after*
    * png_write_info, not before as in the read code, but the 'set' functions
    * must still be called before.  Just set the color space information, never
    * write an interlaced image.
    */

   if (write_16bit != 0)
   {
      /* The gamma here is 1.0 (linear) and the cHRM chunk matches sRGB. */
      png_set_gAMA_fixed(png_ptr, info_ptr, PNG_GAMMA_LINEAR);

      if ((image->flags & PNG_IMAGE_FLAG_COLORSPACE_NOT_sRGB) == 0)
         png_set_cHRM_fixed(png_ptr, info_ptr,
             /* color      x       y */
             /* white */ 31270, 32900,
             /* red   */ 64000, 33000,
             /* green */ 30000, 60000,
             /* blue  */ 15000,  6000
         );
   }

   else if ((image->flags & PNG_IMAGE_FLAG_COLORSPACE_NOT_sRGB) == 0)
      png_set_sRGB(png_ptr, info_ptr, PNG_sRGB_INTENT_PERCEPTUAL);

   /* Else writing an 8-bit file and the *colors* aren't sRGB, but the 8-bit
    * space must still be gamma encoded.
    */
   else
      png_set_gAMA_fixed(png_ptr, info_ptr, PNG_GAMMA_sRGB_INVERSE);

   /* Write the file header. */
   png_write_info(png_ptr, info_ptr);

   /* Now set up the data transformations (*after* the header is written),
    * remove the handled transformations from the 'format' flags for checking.
    *
    * First check for a little endian system if writing 16-bit files.
    */
   if (write_16bit != 0)
   {
      PNG_CONST png_uint_16 le = 0x0001;

      if ((*(png_const_bytep) & le) != 0)
         png_set_swap(png_ptr);
   }

#   ifdef PNG_SIMPLIFIED_WRITE_BGR_SUPPORTED
      if ((format & PNG_FORMAT_FLAG_BGR) != 0)
      {
         if (colormap == 0 && (format & PNG_FORMAT_FLAG_COLOR) != 0)
            png_set_bgr(png_ptr);
         format &= ~PNG_FORMAT_FLAG_BGR;
      }
#   endif

#   ifdef PNG_SIMPLIFIED_WRITE_AFIRST_SUPPORTED
      if ((format & PNG_FORMAT_FLAG_AFIRST) != 0)
      {
         if (colormap == 0 && (format & PNG_FORMAT_FLAG_ALPHA) != 0)
            png_set_swap_alpha(png_ptr);
         format &= ~PNG_FORMAT_FLAG_AFIRST;
      }
#   endif

   /* If there are 16 or fewer color-map entries we wrote a lower bit depth
    * above, but the application data is still byte packed.
    */
   if (colormap != 0 && image->colormap_entries <= 16)
      png_set_packing(png_ptr);

   /* That should have handled all (both) the transforms. */
   if ((format & ~(png_uint_32)(PNG_FORMAT_FLAG_COLOR | PNG_FORMAT_FLAG_LINEAR |
         PNG_FORMAT_FLAG_ALPHA | PNG_FORMAT_FLAG_COLORMAP)) != 0)
      png_error(png_ptr, "png_write_image: unsupported transformation");

   {
      png_const_bytep row = png_voidcast(png_const_bytep, display->buffer);
      ptrdiff_t row_bytes = display->row_stride;

      if (linear != 0)
         row_bytes *= (sizeof (png_uint_16));

      if (row_bytes < 0)
         row += (image->height-1) * (-row_bytes);

      display->first_row = row;
      display->row_bytes = row_bytes;
   }

   /* Apply 'fast' options if the flag is set. */
   if ((image->flags & PNG_IMAGE_FLAG_FAST) != 0)
   {
      png_set_filter(png_ptr, PNG_FILTER_TYPE_BASE, PNG_NO_FILTERS);
      /* NOTE: determined by experiment using pngstest, this reflects some
       * balance between the time to write the image once and the time to read
       * it about 50 times.  The speed-up in pngstest was about 10-20% of the
       * total (user) time on a heavily loaded system.
       */
#   ifdef PNG_WRITE_CUSTOMIZE_COMPRESSION_SUPPORTED
      png_set_compression_level(png_ptr, 3);
#   endif
   }

   /* Check for the cases that currently require a pre-transform on the row
    * before it is written.  This only applies when the input is 16-bit and
    * either there is an alpha channel or it is converted to 8-bit.
    */
   if ((linear != 0 && alpha != 0 ) ||
       (colormap == 0 && display->convert_to_8bit != 0))
   {
      png_bytep row = png_voidcast(png_bytep, png_malloc(png_ptr,
          png_get_rowbytes(png_ptr, info_ptr)));
      int result;

      display->local_row = row;
      if (write_16bit != 0)
         result = png_safe_execute(image, png_write_image_16bit, display);
      else
         result = png_safe_execute(image, png_write_image_8bit, display);
      display->local_row = NULL;

      png_free(png_ptr, row);

      /* Skip the 'write_end' on error: */
      if (result == 0)
         return 0;
   }

   /* Otherwise this is the case where the input is in a format currently
    * supported by the rest of the libpng write code; call it directly.
    */
   else
   {
      png_const_bytep row = png_voidcast(png_const_bytep, display->first_row);
      ptrdiff_t row_bytes = display->row_bytes;
      png_uint_32 y = image->height;

      for (; y > 0; --y)
      {
         png_write_row(png_ptr, row);
         row += row_bytes;
      }
   }

   png_write_end(png_ptr, info_ptr);
   return 1;
}